

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O0

size_t google::protobuf::internal::
       MapPrimitiveFieldByteSize<(google::protobuf::internal::FieldDescriptorLite::CppType)1,int>
                 (Type type,int value)

{
  int value_local;
  Type type_local;
  
  if (type == TYPE_INT32) {
    _value_local = WireFormatLite::Int32Size(value);
  }
  else if (type == TYPE_SFIXED32) {
    _value_local = 4;
  }
  else {
    if (type != TYPE_SINT32) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_field_info.h"
                  ,0x488);
    }
    _value_local = WireFormatLite::SInt32Size(value);
  }
  return _value_local;
}

Assistant:

inline size_t MapPrimitiveFieldByteSize(FieldDescriptor::Type type, T value) {
  // There is a bug in GCC 9.5 where if-constexpr arguments are not understood
  // if encased in a switch statement. A reproduction of the bug can be found
  // at: https://godbolt.org/z/qo51cKe7b
  // This is fixed in GCC 10.1+.
  (void)type;   // Suppress -Wunused-but-set-parameter
  (void)value;  // Suppress -Wunused-but-set-parameter

  if constexpr (cpp_type == FieldDescriptor::CPPTYPE_INT32) {
    static_assert(std::is_same_v<T, int32_t>, "type mismatch");
    switch (type) {
      case FieldDescriptor::TYPE_INT32:
        return WireFormatLite::Int32Size(value);
      case FieldDescriptor::TYPE_SINT32:
        return WireFormatLite::SInt32Size(value);
      case FieldDescriptor::TYPE_SFIXED32:
        return WireFormatLite::kSFixed32Size;
      default:
        Unreachable();
    }
  } else if constexpr (cpp_type == FieldDescriptor::CPPTYPE_INT64) {
    static_assert(std::is_same_v<T, int64_t>, "type mismatch");
    switch (type) {
      case FieldDescriptor::TYPE_INT64:
        return WireFormatLite::Int64Size(value);
      case FieldDescriptor::TYPE_SINT64:
        return WireFormatLite::SInt64Size(value);
      case FieldDescriptor::TYPE_SFIXED64:
        return WireFormatLite::kSFixed64Size;
      default:
        Unreachable();
    }
  } else if constexpr (cpp_type == FieldDescriptor::CPPTYPE_UINT32) {
    static_assert(std::is_same_v<T, uint32_t>, "type mismatch");
    switch (type) {
      case FieldDescriptor::TYPE_UINT32:
        return WireFormatLite::UInt32Size(value);
      case FieldDescriptor::TYPE_FIXED32:
        return WireFormatLite::kSFixed32Size;
      default:
        Unreachable();
    }
  } else if constexpr (cpp_type == FieldDescriptor::CPPTYPE_UINT64) {
    static_assert(std::is_same_v<T, uint64_t>, "type mismatch");
    switch (type) {
      case FieldDescriptor::TYPE_UINT64:
        return WireFormatLite::UInt64Size(value);
      case FieldDescriptor::TYPE_FIXED64:
        return WireFormatLite::kSFixed64Size;
      default:
        Unreachable();
    }
  } else if constexpr (cpp_type == FieldDescriptor::CPPTYPE_ENUM) {
    static_assert(std::is_same_v<T, int>, "type mismatch");
    return WireFormatLite::EnumSize(value);
  } else if constexpr (cpp_type == FieldDescriptor::CPPTYPE_BOOL) {
    static_assert(std::is_same_v<T, bool>, "type mismatch");
    return WireFormatLite::kBoolSize;
  } else if constexpr (cpp_type == FieldDescriptor::CPPTYPE_FLOAT) {
    static_assert(std::is_same_v<T, float>, "type mismatch");
    return WireFormatLite::kFloatSize;
  } else if constexpr (cpp_type == FieldDescriptor::CPPTYPE_DOUBLE) {
    static_assert(std::is_same_v<T, double>, "type mismatch");
    return WireFormatLite::kDoubleSize;
  }
}